

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field.cc
# Opt level: O3

FieldDescriptor *
google::protobuf::compiler::java::anon_unknown_1::ValueField(FieldDescriptor *descriptor)

{
  LogMessage *pLVar1;
  Descriptor *this;
  FieldDescriptor *pFVar2;
  FieldDescriptor *local_50;
  undefined1 local_48 [56];
  
  if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
    local_48._0_8_ = FieldDescriptor::TypeOnceInit;
    local_50 = descriptor;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)local_48,
               &local_50);
  }
  if (descriptor[2] != (FieldDescriptor)0xb) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_map_field_lite.cc"
               ,0x38);
    pLVar1 = internal::LogMessage::operator<<
                       ((LogMessage *)local_48,
                        "CHECK failed: (FieldDescriptor::TYPE_MESSAGE) == (descriptor->type()): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar1);
    internal::LogMessage::~LogMessage((LogMessage *)local_48);
  }
  this = FieldDescriptor::message_type(descriptor);
  if (*(char *)(*(long *)(this + 0x20) + 0x4b) == '\0') {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_map_field_lite.cc"
               ,0x3a);
    pLVar1 = internal::LogMessage::operator<<
                       ((LogMessage *)local_48,"CHECK failed: message->options().map_entry(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar1);
    internal::LogMessage::~LogMessage((LogMessage *)local_48);
  }
  local_48._0_8_ = local_48 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"value","");
  pFVar2 = Descriptor::FindFieldByName(this,(ConstStringParam)local_48);
  if ((undefined1 *)local_48._0_8_ != local_48 + 0x10) {
    operator_delete((void *)local_48._0_8_);
  }
  return pFVar2;
}

Assistant:

const FieldDescriptor* ValueField(const FieldDescriptor* descriptor) {
  GOOGLE_CHECK_EQ(FieldDescriptor::TYPE_MESSAGE, descriptor->type());
  const Descriptor* message = descriptor->message_type();
  GOOGLE_CHECK(message->options().map_entry());
  return message->FindFieldByName("value");
}